

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ma_uint32 mVar4;
  ma_uint64 mVar5;
  uint shift;
  int iVar6;
  ma_int16 *pmVar7;
  ulong uVar8;
  size_t sVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  uint j;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  ma_uint64 totalFramesRead;
  ma_int16 samples16 [2048];
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) {
LAB_001631f2:
    totalFramesRead = 0;
  }
  else {
    if (pBufferOut == (float *)0x0) {
      mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
      return mVar5;
    }
    totalFramesRead = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar4 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar4 != 0) {
        uVar1 = pWav->channels;
        uVar14 = (ulong)mVar4 / (ulong)uVar1;
        totalFramesRead = 0;
        if ((uVar1 <= mVar4) && (mVar4 % (uint)uVar1 == 0)) {
          uVar2 = (uint)uVar14;
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar8 = 0x1000 / (ulong)mVar4;
            if (framesToRead < 0x1000 / (ulong)mVar4) {
              uVar8 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar8,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            uVar8 = pWav->channels * mVar5;
            if (0x1000 < uVar8 * uVar14) {
              return totalFramesRead;
            }
            switch(uVar2) {
            case 1:
              ma_dr_wav_u8_to_f32(pBufferOut,(ma_uint8 *)samples16,uVar8);
              break;
            case 2:
              ma_dr_wav_s16_to_f32(pBufferOut,samples16,uVar8);
              break;
            case 3:
              ma_dr_wav_s24_to_f32(pBufferOut,(ma_uint8 *)samples16,uVar8);
              break;
            case 4:
              ma_dr_wav_s32_to_f32(pBufferOut,(ma_int32 *)samples16,uVar8);
              break;
            default:
              if (uVar2 < 9) {
                pmVar7 = samples16;
                pfVar10 = pBufferOut;
                for (uVar3 = 0; uVar3 <= uVar8 && uVar8 - uVar3 != 0; uVar3 = uVar3 + 1) {
                  lVar13 = 0;
                  uVar11 = 0;
                  uVar12 = uVar14;
                  iVar6 = uVar2 * -8 + 0x40;
                  while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
                    uVar11 = uVar11 | (ulong)*(byte *)((long)pmVar7 + lVar13) <<
                                      ((byte)iVar6 & 0x3f);
                    iVar6 = iVar6 + 8;
                    lVar13 = lVar13 + 1;
                  }
                  pmVar7 = (ma_int16 *)((long)pmVar7 + uVar14);
                  *pfVar10 = (float)((double)(long)uVar11 * 1.0842021724855044e-19);
                  pfVar10 = pfVar10 + 1;
                }
              }
              else {
                memset(pBufferOut,0,uVar8 * 4);
              }
            }
            pBufferOut = pBufferOut + uVar8;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    case 3:
      memset(samples16,0,0x1000);
      if (pWav->bitsPerSample == 0x20) {
        mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
        return mVar5;
      }
      mVar4 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar4 != 0) {
        uVar1 = pWav->channels;
        if (mVar4 < uVar1) {
          return 0;
        }
        if (mVar4 % (uint)uVar1 != 0) {
          return 0;
        }
        iVar6 = (int)((ulong)mVar4 / (ulong)uVar1);
        totalFramesRead = 0;
        while( true ) {
          if (framesToRead == 0) {
            return totalFramesRead;
          }
          uVar14 = 0x1000 / (ulong)mVar4;
          if (framesToRead < 0x1000 / (ulong)mVar4) {
            uVar14 = framesToRead;
          }
          mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar14,samples16);
          if (mVar5 == 0) break;
          uVar14 = pWav->channels * mVar5;
          if (0x1000 < uVar14 * ((ulong)mVar4 / (ulong)uVar1)) {
            return totalFramesRead;
          }
          if (iVar6 == 8) {
            ma_dr_wav_f64_to_f32(pBufferOut,(double *)samples16,uVar14);
          }
          else if (iVar6 == 4) {
            for (uVar8 = 0; uVar12 = uVar8 & 0xffffffff, uVar12 <= uVar14 && uVar14 - uVar12 != 0;
                uVar8 = uVar8 + 1) {
              pBufferOut[uVar8] = *(float *)(samples16 + uVar12 * 2);
            }
          }
          else {
            memset(pBufferOut,0,uVar14 * 4);
          }
          pBufferOut = pBufferOut + uVar14;
          framesToRead = framesToRead - mVar5;
          totalFramesRead = totalFramesRead + mVar5;
        }
        return totalFramesRead;
      }
      goto LAB_001631f2;
    case 4:
    case 5:
      break;
    case 6:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar4 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar4 != 0) {
        uVar1 = pWav->channels;
        totalFramesRead = 0;
        if ((uVar1 <= mVar4) && (mVar4 % (uint)uVar1 == 0)) {
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar14 = 0x1000 / (ulong)mVar4;
            if (framesToRead < 0x1000 / (ulong)mVar4) {
              uVar14 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar14,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            sVar9 = pWav->channels * mVar5;
            if (0x1000 < sVar9 * ((ulong)mVar4 / (ulong)uVar1)) {
              return totalFramesRead;
            }
            ma_dr_wav_alaw_to_f32(pBufferOut,(ma_uint8 *)samples16,sVar9);
            pBufferOut = pBufferOut + sVar9;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    case 7:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar4 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar4 != 0) {
        uVar1 = pWav->channels;
        totalFramesRead = 0;
        if ((uVar1 <= mVar4) && (mVar4 % (uint)uVar1 == 0)) {
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar14 = 0x1000 / (ulong)mVar4;
            if (framesToRead < 0x1000 / (ulong)mVar4) {
              uVar14 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar14,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            sVar9 = pWav->channels * mVar5;
            if (0x1000 < sVar9 * ((ulong)mVar4 / (ulong)uVar1)) {
              return totalFramesRead;
            }
            ma_dr_wav_mulaw_to_f32(pBufferOut,(ma_uint8 *)samples16,sVar9);
            pBufferOut = pBufferOut + sVar9;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    default:
      if (pWav->translatedFormatTag != 0x11) {
        return 0;
      }
    case 2:
      totalFramesRead = 0;
      for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
        uVar14 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar14) {
          uVar14 = framesToRead;
        }
        mVar5 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar14,samples16);
        if (mVar5 == 0) {
          return totalFramesRead;
        }
        ma_dr_wav_s16_to_f32(pBufferOut,samples16,pWav->channels * mVar5);
        pBufferOut = pBufferOut + pWav->channels * mVar5;
        totalFramesRead = totalFramesRead + mVar5;
      }
    }
  }
  return totalFramesRead;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(float) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(float) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_f32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}